

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_get_region_host.cc
# Opt level: O0

string * aliyun::AliGetEndpointHost(string *__return_storage_ptr__,string *region,string *product)

{
  bool bVar1;
  int local_2c;
  int local_28;
  int j;
  int i;
  string *product_local;
  string *region_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28 = 0;
  while (*(long *)((anonymous_namespace)::regions + (long)local_28 * 0x10) != 0) {
    local_2c = 0;
    while (*(long *)(*(long *)((anonymous_namespace)::regions + (long)local_28 * 0x10 + 8) +
                    (long)local_2c * 0x10) != 0) {
      bVar1 = std::operator==(*(char **)(*(long *)((anonymous_namespace)::regions +
                                                  (long)local_28 * 0x10 + 8) + (long)local_2c * 0x10
                                        ),product);
      if (bVar1) {
        std::__cxx11::string::operator=
                  ((string *)__return_storage_ptr__,
                   *(char **)(*(long *)((anonymous_namespace)::regions + (long)local_28 * 0x10 + 8)
                              + 8 + (long)local_2c * 0x10));
      }
      local_2c = local_2c + 1;
    }
    local_28 = local_28 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AliGetEndpointHost(std::string region, std::string product) {
  std::string ret;
  for(int i = 0; regions[i].region_name_ ; i++) {
    for(int j = 0; regions[i].productions[j].product_name_ ; j++) {
      if(regions[i].productions[j].product_name_ == product) {
        ret = regions[i].productions[j].domain_name_;
      }
    }
  }
  return ret;
}